

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

_Bool array_container_iterate64
                (array_container_t *cont,uint32_t base,roaring_iterator64 iterator,
                uint64_t high_bits,void *ptr)

{
  ulong uVar1;
  ulong in_RCX;
  code *in_RDX;
  int in_ESI;
  int *in_RDI;
  undefined8 in_R8;
  int i;
  int local_34;
  
  local_34 = 0;
  while( true ) {
    if (*in_RDI <= local_34) {
      return true;
    }
    uVar1 = (*in_RDX)(in_RCX | (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_34 * 2) +
                               in_ESI,in_R8);
    if ((uVar1 & 1) == 0) break;
    local_34 = local_34 + 1;
  }
  return false;
}

Assistant:

bool array_container_iterate64(const array_container_t *cont, uint32_t base,
                               roaring_iterator64 iterator, uint64_t high_bits,
                               void *ptr) {
    for (int i = 0; i < cont->cardinality; i++)
        if (!iterator(high_bits | (uint64_t)(cont->array[i] + base), ptr))
            return false;
    return true;
}